

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O2

void __thiscall
Engine_testConstructNoHandler_Test::TestBody(Engine_testConstructNoHandler_Test *this)

{
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *pvVar1;
  char *pcVar2;
  AssertHelper local_c0;
  AssertionResult gtest_ar_2;
  AssertHelper local_a8;
  Engine e1;
  Engine e;
  string local_30;
  
  Engine::Engine(&e,"foo");
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&e1,"\"foo\"","e.prefix",(char (*) [4])0x166245,&e.prefix);
  if ((char)e1.prefix._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (e1.prefix._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)e1.prefix._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
               ,0xb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&gtest_ar_2);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&e1.prefix._M_string_length);
    local_c0.data_ = local_c0.data_ & 0xffffffff00000000;
    pvVar1 = Engine::GetHandlers(&e);
    gtest_ar_2._0_8_ =
         (long)(pvVar1->
               super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(pvVar1->
               super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 3;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&e1,"0","e.GetHandlers().size()",(int *)&local_c0,
               (unsigned_long *)&gtest_ar_2);
    if ((char)e1.prefix._M_dataplus._M_p != '\0') {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&e1.prefix._M_string_length);
      std::__cxx11::string::string((string *)&local_30,"bar",(allocator *)&gtest_ar_2);
      Engine::Engine(&e1,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
                ((internal *)&gtest_ar_2,"\"bar\"","e1.prefix",(char (*) [4])"bar",&e1.prefix);
      if (gtest_ar_2.success_ == false) {
        testing::Message::Message((Message *)&local_c0);
        if (gtest_ar_2.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                   ,0xe,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_c0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_2.message_);
        local_a8.data_._0_4_ = 0;
        pvVar1 = Engine::GetHandlers(&e1);
        local_c0.data_ =
             (AssertHelperData *)
             ((long)(pvVar1->
                    super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar1->
                    super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3);
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&gtest_ar_2,"0","e1.GetHandlers().size()",(int *)&local_a8,
                   (unsigned_long *)&local_c0);
        if (gtest_ar_2.success_ == false) {
          testing::Message::Message((Message *)&local_c0);
          if (gtest_ar_2.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                     ,0xf,pcVar2);
          testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_a8);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_c0);
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_2.message_);
      Engine::~Engine(&e1);
      goto LAB_0011161b;
    }
    testing::Message::Message((Message *)&gtest_ar_2);
    if (e1.prefix._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)e1.prefix._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
               ,0xc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&gtest_ar_2);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_c0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_2);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&e1.prefix._M_string_length);
LAB_0011161b:
  Engine::~Engine(&e);
  return;
}

Assistant:

TEST(Engine, testConstructNoHandler) {
    Engine e("foo");
    ASSERT_EQ("foo", e.prefix);
    ASSERT_EQ(0, e.GetHandlers().size());
    Engine e1(std::string("bar"));
    ASSERT_EQ("bar", e1.prefix);
    ASSERT_EQ(0, e1.GetHandlers().size());
}